

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

TriQuadMesh * __thiscall
pbrt::TriQuadMesh::
Displace<displace(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__2,displace(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__1>
          (TriQuadMesh *this,anon_class_1_0_00000001 *dist,Float maxDist,
          anon_class_24_3_3862dfb3 *displace,FileLoc *loc)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  TriQuadMesh *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  TriQuadMesh *in_RSI;
  TriQuadMesh *in_RDI;
  int i;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  edgeSplit;
  vector<int,_std::allocator<int>_> oldTriIndices;
  TriQuadMesh *outputMesh;
  TriQuadMesh *in_stack_000001c8;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  *in_stack_000001d0;
  int in_stack_000001d8;
  int in_stack_000001dc;
  int in_stack_000001e0;
  Float in_stack_000001e4;
  anon_class_1_0_00000001 *in_stack_000001e8;
  TriQuadMesh *in_stack_000001f0;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  *in_stack_ffffffffffffff08;
  polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>
  in_stack_ffffffffffffff10;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *in_stack_ffffffffffffff20;
  TriQuadMesh *in_stack_ffffffffffffff48;
  TriQuadMesh *__x;
  int local_94;
  int in_stack_ffffffffffffff74;
  Point2f *in_stack_ffffffffffffff78;
  Normal3f *in_stack_ffffffffffffff80;
  Point3f *in_stack_ffffffffffffff88;
  anon_class_24_3_3862dfb3 *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_60;
  byte local_31;
  
  __x = in_RDI;
  bVar1 = std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::empty
                    ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                     in_stack_ffffffffffffff20);
  if (bVar1) {
    ErrorExit((FileLoc *)in_stack_ffffffffffffff10.memoryResource,(char *)in_stack_ffffffffffffff08)
    ;
  }
  local_31 = 0;
  TriQuadMesh(in_RDI,in_stack_ffffffffffffff48);
  ConvertToOnlyTriangles(in_RSI);
  bVar1 = std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::empty
                    (in_stack_ffffffffffffff20);
  if (bVar1) {
    ComputeNormals(in_stack_000001c8);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(vector<int,_std::allocator<int>_> *)__x);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x440fc9);
  pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>::
  polymorphic_allocator
            ((polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_> *)
             in_stack_ffffffffffffff10.memoryResource);
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  ::HashMap(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  local_94 = 0;
  while( true ) {
    uVar2 = (ulong)local_94;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_60);
    if (sVar3 / 3 <= uVar2) break;
    std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)(local_94 * 3));
    std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)(local_94 * 3 + 1));
    std::vector<int,_std::allocator<int>_>::operator[](&local_60,(long)(local_94 * 3 + 2));
    Refine<displace(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__2&>
              (in_stack_000001f0,in_stack_000001e8,in_stack_000001e4,in_stack_000001e0,
               in_stack_000001dc,in_stack_000001d8,in_stack_000001d0);
    local_94 = local_94 + 1;
  }
  this_00 = (TriQuadMesh *)
            std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::data
                      ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)
                       0x44111d);
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::data
            ((vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *)0x441130);
  this_01 = (vector<int,_std::allocator<int>_> *)
            std::vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::data
                      ((vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                       0x441143);
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::size(&in_RDI->p);
  ::displace::anon_class_24_3_3862dfb3::operator()
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  ComputeNormals(in_stack_000001c8);
  local_31 = 1;
  HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
  ::~HashMap((HashMap<std::pair<int,_int>,_int,_pbrt::HashIntPair,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<std::pair<int,_int>,_int>_>_>_>
              *)0x44118d);
  std::vector<int,_std::allocator<int>_>::~vector(this_01);
  if ((local_31 & 1) == 0) {
    ~TriQuadMesh(this_00);
  }
  return __x;
}

Assistant:

TriQuadMesh Displace(Dist &&dist, Float maxDist, Disp &&displace,
                         const FileLoc *loc = nullptr) const {
        if (uv.empty())
            ErrorExit(loc, "Vertex uvs are currently required by Displace(). Sorry.\n");

        // Prepare the output mesh
        TriQuadMesh outputMesh = *this;
        outputMesh.ConvertToOnlyTriangles();
        if (outputMesh.n.empty())
            outputMesh.ComputeNormals();
        std::vector<int> oldTriIndices(outputMesh.triIndices);
        outputMesh.triIndices.clear();

        // Refine
        HashMap<std::pair<int, int>, int, HashIntPair> edgeSplit({});
        for (int i = 0; i < oldTriIndices.size() / 3; ++i)
            outputMesh.Refine(dist, maxDist, oldTriIndices[3 * i],
                              oldTriIndices[3 * i + 1], oldTriIndices[3 * i + 2],
                              edgeSplit);

        // Displace
        displace(outputMesh.p.data(), outputMesh.n.data(), outputMesh.uv.data(),
                 outputMesh.p.size());

        outputMesh.ComputeNormals();

        return outputMesh;
    }